

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json11.cpp
# Opt level: O1

Json __thiscall json11::anon_unknown_22::JsonParser::parse_json(JsonParser *this,int depth)

{
  char *pcVar1;
  size_t sVar2;
  pointer pcVar3;
  double value;
  undefined8 uVar4;
  undefined8 uVar5;
  byte bVar6;
  char cVar7;
  int iVar8;
  mapped_type *pmVar9;
  size_t sVar10;
  long *plVar11;
  uint uVar12;
  size_t sVar13;
  string *psVar14;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var15;
  char c;
  int in_EDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  size_t sVar17;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_05;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_06;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_07;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_08;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_09;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_10;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_11;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_12;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_13;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_14;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_15;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_16;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_17;
  undefined4 in_register_00000034;
  JsonParser *this_00;
  undefined1 auVar18 [8];
  bool c_00;
  Json JVar19;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json11::Json,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json11::Json>_>_>
  data_1;
  vector<json11::Json,_std::allocator<json11::Json>_> data;
  size_type __dnew;
  char buf [12];
  undefined1 local_108 [8];
  undefined1 local_100 [24];
  _Base_ptr local_e8;
  size_t local_e0;
  undefined1 local_d8 [16];
  undefined1 local_c8 [24];
  undefined1 local_b0 [16];
  undefined1 local_a0 [16];
  string local_90;
  Json local_70;
  Json local_60;
  char local_4c [12];
  Json local_40;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var16;
  
  this_00 = (JsonParser *)CONCAT44(in_register_00000034,depth);
  if (200 < in_EDX) {
    local_108 = (undefined1  [8])(local_100 + 8);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_108,"exceeded maximum nesting depth","");
    JVar19 = fail(this,(string *)this_00);
    _Var16._M_pi = JVar19.m_ptr.super___shared_ptr<json11::JsonValue,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi;
LAB_00139fd4:
    local_c8._0_8_ = local_100._8_8_;
    auVar18 = local_108;
    if (local_108 == (undefined1  [8])(local_100 + 8)) goto LAB_0013a005;
    goto LAB_00139fe2;
  }
  bVar6 = get_next_token(this_00);
  if (this_00->failed == true) {
    Json::Json((Json *)this);
    _Var16._M_pi = extraout_RDX_00;
    goto LAB_0013a005;
  }
  c_00 = 9 < (byte)(bVar6 - 0x30);
  if (bVar6 == 0x2d || !c_00) {
    sVar2 = this_00->i;
    sVar13 = sVar2 - 1;
    this_00->i = sVar13;
    pcVar3 = (this_00->str->_M_dataplus)._M_p;
    sVar17 = sVar13;
    if (pcVar3[sVar2 - 1] == '-') {
      sVar17 = sVar2;
    }
    this_00->i = sVar17;
    if (pcVar3[sVar17] == '0') {
      this_00->i = sVar17 + 1;
      if ((byte)(pcVar3[sVar17 + 1] - 0x30U) < 10) {
        local_108 = (undefined1  [8])(local_100 + 8);
        local_b0._0_8_ = (string *)0x23;
        local_108 = (undefined1  [8])
                    std::__cxx11::string::_M_create((ulong *)local_108,(ulong)(local_c8 + 0x18));
        local_100._8_8_ = local_b0._0_8_;
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((long)local_108 + 0x10))->
        _vptr__Sp_counted_base = (_func_int **)0x64657474696d7265;
        *(undefined8 *)
         &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((long)local_108 + 0x10))->_M_use_count =
             0x626d756e206e6920;
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_108)->_vptr__Sp_counted_base =
             (_func_int **)0x20676e696461656c;
        *(undefined8 *)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_108)->_M_use_count =
             0x7020746f6e207330;
        *(undefined4 *)
         ((long)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((long)local_108 + 0x10))->
                 _M_weak_count + 3) = 0x73726562;
        local_100._0_8_ = local_b0._0_8_;
        *(undefined1 *)
         ((long)&((_Alloc_hider *)local_b0._0_8_)->_M_p +
         (long)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_108)->_vptr__Sp_counted_base)
             = 0;
        JVar19 = fail(this,(string *)this_00);
        _Var16._M_pi = JVar19.m_ptr.
                       super___shared_ptr<json11::JsonValue,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                       ._M_pi;
        goto LAB_00139fd4;
      }
    }
    else {
      if (8 < (byte)(pcVar3[sVar17] - 0x31U)) {
        uVar12 = (uint)(this_00->str->_M_dataplus)._M_p[sVar17];
        if ((int)uVar12 < 0x20) {
          snprintf(local_a0 + 0x10,0xc,"(%d)");
        }
        else {
          snprintf(local_a0 + 0x10,0xc,"\'%c\' (%d)",(ulong)uVar12,(ulong)uVar12);
        }
        local_d8._0_8_ = (string *)(local_d8 + 0x10);
        sVar10 = strlen(local_a0 + 0x10);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_d8,local_a0 + 0x10,local_a0 + sVar10 + 0x10);
        plVar11 = (long *)std::__cxx11::string::replace((ulong)local_d8,0,(char *)0x0,0x15b5d9);
        psVar14 = (string *)(plVar11 + 2);
        if ((string *)*plVar11 == psVar14) {
          local_a0._0_8_ = (psVar14->_M_dataplus)._M_p;
          local_a0._8_8_ = plVar11[3];
          local_b0._0_8_ = (string *)(local_b0 + 0x10);
        }
        else {
          local_a0._0_8_ = (psVar14->_M_dataplus)._M_p;
          local_b0._0_8_ = (string *)*plVar11;
        }
        local_b0._8_8_ = plVar11[1];
        *plVar11 = (long)psVar14;
        plVar11[1] = 0;
        *(undefined1 *)(plVar11 + 2) = 0;
        plVar11 = (long *)std::__cxx11::string::append(local_c8 + 0x18);
        p_Var15 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(plVar11 + 2);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)*plVar11 == p_Var15) {
          local_100._8_8_ = p_Var15->_vptr__Sp_counted_base;
          local_100._16_8_ = plVar11[3];
          local_108 = (undefined1  [8])(local_100 + 8);
        }
        else {
          local_100._8_8_ = p_Var15->_vptr__Sp_counted_base;
          local_108 = (undefined1  [8])*plVar11;
        }
        local_100._0_8_ = plVar11[1];
        *plVar11 = (long)p_Var15;
        plVar11[1] = 0;
        *(undefined1 *)(plVar11 + 2) = 0;
        JVar19 = fail(this,(string *)this_00);
        _Var16._M_pi = JVar19.m_ptr.
                       super___shared_ptr<json11::JsonValue,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                       ._M_pi;
        if (local_108 != (undefined1  [8])(local_100 + 8)) {
          operator_delete((void *)local_108,(ulong)(local_100._8_8_ + 1));
          _Var16._M_pi = extraout_RDX_14;
        }
        if ((string *)local_b0._0_8_ != (string *)(local_b0 + 0x10)) {
          operator_delete((void *)local_b0._0_8_,
                          (ulong)((long)&((_Alloc_hider *)local_a0._0_8_)->_M_p + 1));
          _Var16._M_pi = extraout_RDX_15;
        }
        auVar18 = (undefined1  [8])local_d8._0_8_;
        if ((string *)local_d8._0_8_ == (string *)(local_d8 + 0x10)) goto LAB_0013a005;
        goto LAB_00139fe2;
      }
      do {
        sVar17 = sVar17 + 1;
        this_00->i = sVar17;
      } while ((byte)(pcVar3[sVar17] - 0x30U) < 10);
    }
    sVar17 = this_00->i;
    cVar7 = pcVar3[sVar17];
    if (sVar17 - sVar13 < 10) {
      if (cVar7 == '.') {
LAB_0013a27b:
        this_00->i = sVar17 + 1;
        if (9 < (byte)(pcVar3[sVar17 + 1] - 0x30U)) {
          local_108 = (undefined1  [8])(local_100 + 8);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_108,"at least one digit required in fractional part","");
          JVar19 = fail(this,(string *)this_00);
          _Var16._M_pi = JVar19.m_ptr.
                         super___shared_ptr<json11::JsonValue,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi;
          goto LAB_00139fd4;
        }
        sVar17 = sVar17 + 2;
        do {
          this_00->i = sVar17;
          pcVar1 = pcVar3 + sVar17;
          sVar17 = sVar17 + 1;
        } while ((byte)(*pcVar1 - 0x30U) < 10);
      }
      else if ((cVar7 != 'E') && (cVar7 != 'e')) {
        iVar8 = atoi(pcVar3 + (sVar2 - 1));
        Json::Json((Json *)this,iVar8);
        _Var16._M_pi = extraout_RDX_01;
        goto LAB_0013a005;
      }
    }
    else if (cVar7 == '.') goto LAB_0013a27b;
    sVar13 = this_00->i;
    if ((byte)(pcVar3[sVar13] | 0x20U) == 0x65) {
      this_00->i = sVar13 + 1;
      if ((pcVar3[sVar13 + 1] == '-') || (pcVar3[sVar13 + 1] == '+')) {
        this_00->i = sVar13 + 2;
      }
      sVar13 = this_00->i;
      if (9 < (byte)(pcVar3[sVar13] - 0x30U)) {
        local_108 = (undefined1  [8])(local_100 + 8);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_108,"at least one digit required in exponent","");
        JVar19 = fail(this,(string *)this_00);
        _Var16._M_pi = JVar19.m_ptr.
                       super___shared_ptr<json11::JsonValue,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                       ._M_pi;
        goto LAB_00139fd4;
      }
      do {
        sVar13 = sVar13 + 1;
        this_00->i = sVar13;
      } while ((byte)(pcVar3[sVar13] - 0x30U) < 10);
    }
    value = strtod(pcVar3 + (sVar2 - 1),(char **)0x0);
    Json::Json((Json *)this,value);
    _Var16._M_pi = extraout_RDX_03;
    goto LAB_0013a005;
  }
  if (0x6d < bVar6) {
    if (bVar6 == 0x6e) {
      local_108 = (undefined1  [8])(local_100 + 8);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_108,"null","");
      Json::Json(&local_40);
      JVar19 = expect(this,(string *)this_00,(Json *)local_108);
      _Var16._M_pi = JVar19.m_ptr.super___shared_ptr<json11::JsonValue,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi;
      if (local_40.m_ptr.super___shared_ptr<json11::JsonValue,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_40.m_ptr.super___shared_ptr<json11::JsonValue,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
        _Var16._M_pi = extraout_RDX_05;
      }
      local_c8._0_8_ = local_100._8_8_;
      auVar18 = local_108;
      if (local_108 == (undefined1  [8])(local_100 + 8)) goto LAB_0013a005;
      goto LAB_00139fe2;
    }
    if (bVar6 != 0x7b) {
      if (bVar6 != 0x74) goto LAB_0013a3a9;
      local_108 = (undefined1  [8])(local_100 + 8);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_108,"true","");
      Json::Json(&local_60,true);
      JVar19 = expect(this,(string *)this_00,(Json *)local_108);
      _Var16._M_pi = JVar19.m_ptr.super___shared_ptr<json11::JsonValue,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi;
      local_70.m_ptr.super___shared_ptr<json11::JsonValue,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = local_60.m_ptr.super___shared_ptr<json11::JsonValue,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
LAB_0013a233:
      if (local_70.m_ptr.super___shared_ptr<json11::JsonValue,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_70.m_ptr.super___shared_ptr<json11::JsonValue,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
        _Var16._M_pi = extraout_RDX_02;
      }
      goto LAB_00139fd4;
    }
    local_100._16_8_ = local_100;
    local_100._0_8_ = local_100._0_8_ & 0xffffffff00000000;
    local_100._8_8_ = 0;
    local_e0 = 0;
    local_e8 = (_Base_ptr)local_100._16_8_;
    bVar6 = get_next_token(this_00);
    _Var16._M_pi = extraout_RDX_07;
    if (bVar6 == 0x7d) {
LAB_0013a8df:
      Json::Json((Json *)this,(object *)local_108);
    }
    else {
      do {
        if (bVar6 != 0x22) {
          esc_abi_cxx11_((string *)local_d8,(json11 *)(ulong)(uint)(int)(char)bVar6,
                         (char)_Var16._M_pi);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (local_c8 + 0x18),"expected \'\"\' in object, got ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_d8);
          fail(this,(string *)this_00);
          if ((string *)local_b0._0_8_ != (string *)(local_b0 + 0x10)) {
            operator_delete((void *)local_b0._0_8_,
                            (ulong)((long)&((_Alloc_hider *)local_a0._0_8_)->_M_p + 1));
          }
          if ((string *)local_d8._0_8_ != (string *)(local_d8 + 0x10)) {
            operator_delete((void *)local_d8._0_8_,(ulong)(local_c8._0_8_ + 1));
          }
          goto LAB_0013a8ea;
        }
        (anonymous_namespace)::JsonParser::parse_string_abi_cxx11_
                  ((string *)(local_c8 + 0x18),this_00);
        if (this_00->failed == true) {
LAB_0013a4db:
          Json::Json((Json *)this);
          _Var16._M_pi = extraout_RDX_08;
LAB_0013a6e7:
          iVar8 = 1;
        }
        else {
          bVar6 = get_next_token(this_00);
          if (bVar6 != 0x3a) {
            if ((char)bVar6 < ' ') {
              snprintf(local_4c,0xc,"(%d)",(ulong)(uint)(int)(char)bVar6);
            }
            else {
              snprintf(local_4c,0xc,"\'%c\' (%d)",(ulong)bVar6,(ulong)bVar6);
            }
            local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
            sVar10 = strlen(local_4c);
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)(local_a0 + 0x10),local_4c,local_4c + sVar10);
            plVar11 = (long *)std::__cxx11::string::replace
                                        ((ulong)(local_a0 + 0x10),0,(char *)0x0,0x15b533);
            psVar14 = (string *)(plVar11 + 2);
            if ((string *)*plVar11 == psVar14) {
              local_c8._0_8_ = (psVar14->_M_dataplus)._M_p;
              local_c8._8_8_ = plVar11[3];
              local_d8._0_8_ = (string *)(local_d8 + 0x10);
            }
            else {
              local_c8._0_8_ = (psVar14->_M_dataplus)._M_p;
              local_d8._0_8_ = (string *)*plVar11;
            }
            local_d8._8_8_ = plVar11[1];
            *plVar11 = (long)psVar14;
            plVar11[1] = 0;
            *(undefined1 *)(plVar11 + 2) = 0;
            JVar19 = fail(this,(string *)this_00);
            _Var16._M_pi = JVar19.m_ptr.
                           super___shared_ptr<json11::JsonValue,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi;
            if ((string *)local_d8._0_8_ != (string *)(local_d8 + 0x10)) {
LAB_0013a6b8:
              operator_delete((void *)local_d8._0_8_,(ulong)(local_c8._0_8_ + 1));
              _Var16._M_pi = extraout_RDX_10;
            }
LAB_0013a6c5:
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_90._M_dataplus._M_p != &local_90.field_2) {
              operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
              _Var16._M_pi = extraout_RDX_11;
            }
            goto LAB_0013a6e7;
          }
          parse_json((JsonParser *)local_d8,depth);
          pmVar9 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json11::Json,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json11::Json>_>_>
                   ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json11::Json,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json11::Json>_>_>
                                 *)local_108,(key_type *)(local_c8 + 0x18));
          uVar5 = local_d8._8_8_;
          uVar4 = local_d8._0_8_;
          local_d8._0_8_ = (string *)0x0;
          local_d8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          p_Var15 = (pmVar9->m_ptr).
                    super___shared_ptr<json11::JsonValue,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                    _M_pi;
          (pmVar9->m_ptr).super___shared_ptr<json11::JsonValue,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)uVar4;
          (pmVar9->m_ptr).super___shared_ptr<json11::JsonValue,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar5;
          if (p_Var15 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var15);
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_);
          }
          if (this_00->failed == true) goto LAB_0013a4db;
          bVar6 = get_next_token(this_00);
          if (bVar6 == 0x2c) {
            bVar6 = get_next_token(this_00);
            iVar8 = 0;
            _Var16._M_pi = extraout_RDX_13;
          }
          else {
            iVar8 = 3;
            _Var16._M_pi = extraout_RDX_09;
            if (bVar6 != 0x7d) {
              esc_abi_cxx11_((string *)(local_a0 + 0x10),(json11 *)(ulong)(uint)(int)(char)bVar6,
                             (char)extraout_RDX_09);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_d8,"expected \',\' in object, got ",(string *)(local_a0 + 0x10));
              JVar19 = fail(this,(string *)this_00);
              _Var16._M_pi = JVar19.m_ptr.
                             super___shared_ptr<json11::JsonValue,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi;
              if ((string *)local_d8._0_8_ != (string *)(local_d8 + 0x10)) goto LAB_0013a6b8;
              goto LAB_0013a6c5;
            }
          }
        }
        if ((string *)local_b0._0_8_ != (string *)(local_b0 + 0x10)) {
          operator_delete((void *)local_b0._0_8_,
                          (ulong)((long)&((_Alloc_hider *)local_a0._0_8_)->_M_p + 1));
          _Var16._M_pi = extraout_RDX_12;
        }
      } while (iVar8 == 0);
      if (iVar8 == 3) goto LAB_0013a8df;
    }
LAB_0013a8ea:
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json11::Json>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json11::Json>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json11::Json>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json11::Json>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json11::Json>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json11::Json>_>_>
                 *)local_108);
    _Var16._M_pi = extraout_RDX_16;
    goto LAB_0013a005;
  }
  if (bVar6 == 0x22) {
    (anonymous_namespace)::JsonParser::parse_string_abi_cxx11_((string *)local_108,this_00);
    Json::Json((Json *)this,(string *)local_108);
    _Var16._M_pi = extraout_RDX_04;
    local_c8._0_8_ = local_100._8_8_;
    auVar18 = local_108;
    if (local_108 == (undefined1  [8])(local_100 + 8)) goto LAB_0013a005;
  }
  else {
    if (bVar6 == 0x5b) {
      local_d8._0_8_ = (string *)0x0;
      local_d8._8_8_ = (pointer)0x0;
      local_c8._0_8_ = (string *)0x0;
      cVar7 = get_next_token(this_00);
      if (cVar7 == ']') {
LAB_0013a903:
        Json::Json((Json *)this,(array *)local_d8);
      }
      else {
        while( true ) {
          this_00->i = this_00->i - 1;
          parse_json((JsonParser *)local_108,depth);
          std::vector<json11::Json,_std::allocator<json11::Json>_>::emplace_back<json11::Json>
                    ((vector<json11::Json,_std::allocator<json11::Json>_> *)local_d8,
                     (Json *)local_108);
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_100._0_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_100._0_8_);
          }
          if (this_00->failed == true) {
            Json::Json((Json *)this);
            goto LAB_0013a9f9;
          }
          cVar7 = get_next_token(this_00);
          if (cVar7 != ',') break;
          get_next_token(this_00);
        }
        if (cVar7 == ']') goto LAB_0013a903;
        esc_abi_cxx11_((string *)(local_c8 + 0x18),(json11 *)(ulong)(uint)(int)cVar7,c);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_108,"expected \',\' in list, got ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (local_c8 + 0x18));
        fail(this,(string *)this_00);
        if (local_108 != (undefined1  [8])(local_100 + 8)) {
          operator_delete((void *)local_108,(ulong)(local_100._8_8_ + 1));
        }
        if ((string *)local_b0._0_8_ != (string *)(local_b0 + 0x10)) {
          operator_delete((void *)local_b0._0_8_,
                          (ulong)((long)&((_Alloc_hider *)local_a0._0_8_)->_M_p + 1));
        }
      }
LAB_0013a9f9:
      std::vector<json11::Json,_std::allocator<json11::Json>_>::~vector
                ((vector<json11::Json,_std::allocator<json11::Json>_> *)local_d8);
      _Var16._M_pi = extraout_RDX_17;
      goto LAB_0013a005;
    }
    if (bVar6 == 0x66) {
      local_108 = (undefined1  [8])(local_100 + 8);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_108,"false","");
      Json::Json(&local_70,false);
      JVar19 = expect(this,(string *)this_00,(Json *)local_108);
      _Var16._M_pi = JVar19.m_ptr.super___shared_ptr<json11::JsonValue,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi;
      goto LAB_0013a233;
    }
LAB_0013a3a9:
    esc_abi_cxx11_((string *)(local_c8 + 0x18),(json11 *)(ulong)(uint)(int)(char)bVar6,c_00);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108,
                   "expected value, got ",(string *)(local_c8 + 0x18));
    JVar19 = fail(this,(string *)this_00);
    _Var16._M_pi = JVar19.m_ptr.super___shared_ptr<json11::JsonValue,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi;
    if (local_108 != (undefined1  [8])(local_100 + 8)) {
      operator_delete((void *)local_108,(ulong)(local_100._8_8_ + 1));
      _Var16._M_pi = extraout_RDX_06;
    }
    local_c8._0_8_ = local_a0._0_8_;
    auVar18 = (undefined1  [8])local_b0._0_8_;
    if ((string *)local_b0._0_8_ == (string *)(local_b0 + 0x10)) goto LAB_0013a005;
  }
LAB_00139fe2:
  operator_delete((void *)auVar18,(ulong)((long)&(((string *)local_c8._0_8_)->_M_dataplus)._M_p + 1)
                 );
  _Var16._M_pi = extraout_RDX;
LAB_0013a005:
  JVar19.m_ptr.super___shared_ptr<json11::JsonValue,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var16._M_pi;
  JVar19.m_ptr.super___shared_ptr<json11::JsonValue,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (Json)JVar19.m_ptr.super___shared_ptr<json11::JsonValue,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Json parse_json(int depth) {
        if (depth > max_depth) {
            return fail("exceeded maximum nesting depth");
        }

        char ch = get_next_token();
        if (failed)
            return Json();

        if (ch == '-' || (ch >= '0' && ch <= '9')) {
            i--;
            return parse_number();
        }

        if (ch == 't')
            return expect("true", true);

        if (ch == 'f')
            return expect("false", false);

        if (ch == 'n')
            return expect("null", Json());

        if (ch == '"')
            return parse_string();

        if (ch == '{') {
            map<string, Json> data;
            ch = get_next_token();
            if (ch == '}')
                return data;

            while (1) {
                if (ch != '"')
                    return fail("expected '\"' in object, got " + esc(ch));

                string key = parse_string();
                if (failed)
                    return Json();

                ch = get_next_token();
                if (ch != ':')
                    return fail("expected ':' in object, got " + esc(ch));

                data[std::move(key)] = parse_json(depth + 1);
                if (failed)
                    return Json();

                ch = get_next_token();
                if (ch == '}')
                    break;
                if (ch != ',')
                    return fail("expected ',' in object, got " + esc(ch));

                ch = get_next_token();
            }
            return data;
        }

        if (ch == '[') {
            vector<Json> data;
            ch = get_next_token();
            if (ch == ']')
                return data;

            while (1) {
                i--;
                data.push_back(parse_json(depth + 1));
                if (failed)
                    return Json();

                ch = get_next_token();
                if (ch == ']')
                    break;
                if (ch != ',')
                    return fail("expected ',' in list, got " + esc(ch));

                ch = get_next_token();
                (void)ch;
            }
            return data;
        }

        return fail("expected value, got " + esc(ch));
    }